

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O3

shared_ptr<const_iDynTree::XMLDocument> __thiscall iDynTree::XMLParser::document(XMLParser *this)

{
  _Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  shared_ptr<const_iDynTree::XMLDocument> sVar4;
  shared_ptr<const_iDynTree::XMLDocument> sVar5;
  
  _Var1._M_head_impl =
       (this->m_pimpl)._M_t.
       super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
       .super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>._M_head_impl;
  _Var3._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 &((_Var1._M_head_impl)->m_document).
                  super___shared_ptr<iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>;
  in_RDI->_vptr_XMLDocument = (_func_int **)_Var3._M_pi;
  _Var2._M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&(_Var1._M_head_impl)->m_document + 8))->_M_pi;
  (in_RDI->m_pimpl)._M_t.
  super___uniq_ptr_impl<iDynTree::XMLDocument::XMLDocumentPimpl,_std::default_delete<iDynTree::XMLDocument::XMLDocumentPimpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_iDynTree::XMLDocument::XMLDocumentPimpl_*,_std::default_delete<iDynTree::XMLDocument::XMLDocumentPimpl>_>
  .super__Head_base<0UL,_iDynTree::XMLDocument::XMLDocumentPimpl_*,_false>._M_head_impl =
       (XMLDocumentPimpl *)_Var2._M_pi;
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
      sVar4.super___shared_ptr<const_iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar4.super___shared_ptr<const_iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           in_RDI;
      return (shared_ptr<const_iDynTree::XMLDocument>)
             sVar4.super___shared_ptr<const_iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  sVar5.super___shared_ptr<const_iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  sVar5.super___shared_ptr<const_iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<const_iDynTree::XMLDocument>)
         sVar5.super___shared_ptr<const_iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const XMLDocument> XMLParser::document() const
    {
        assert(m_pimpl);
        return m_pimpl->m_document;
    }